

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationDataBuilder::addContextTrie
          (CollationDataBuilder *this,uint32_t defaultCE32,UCharsTrieBuilder *trieBuilder,
          UErrorCode *errorCode)

{
  short sVar1;
  int32_t iVar2;
  UnicodeString *pUVar3;
  UnicodeString context;
  UnicodeString trieString;
  
  context.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  context.fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar3 = UnicodeString::append(&context,(char16_t)(defaultCE32 >> 0x10));
  UnicodeString::append(pUVar3,(char16_t)defaultCE32);
  trieString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  trieString.fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar3 = UCharsTrieBuilder::buildUnicodeString
                     (trieBuilder,USTRINGTRIE_BUILD_SMALL,&trieString,errorCode);
  UnicodeString::append(&context,pUVar3);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = UnicodeString::indexOf(&this->contexts,&context);
    if (iVar2 < 0) {
      sVar1 = (this->contexts).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->contexts).fUnion.fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      UnicodeString::append(&this->contexts,&context);
    }
  }
  else {
    iVar2 = -1;
  }
  UnicodeString::~UnicodeString(&trieString);
  UnicodeString::~UnicodeString(&context);
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::addContextTrie(uint32_t defaultCE32, UCharsTrieBuilder &trieBuilder,
                                     UErrorCode &errorCode) {
    UnicodeString context;
    context.append((UChar)(defaultCE32 >> 16)).append((UChar)defaultCE32);
    UnicodeString trieString;
    context.append(trieBuilder.buildUnicodeString(USTRINGTRIE_BUILD_SMALL, trieString, errorCode));
    if(U_FAILURE(errorCode)) { return -1; }
    int32_t index = contexts.indexOf(context);
    if(index < 0) {
        index = contexts.length();
        contexts.append(context);
    }
    return index;
}